

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O2

AutoCloseFd __thiscall kj::anon_unknown_8::DiskFilesystem::openDir(DiskFilesystem *this,char *dir)

{
  int iVar1;
  int osErrorNumber;
  Fault f;
  Fault local_20;
  
  do {
    iVar1 = open(dir,0x90000);
    if (-1 < iVar1) goto LAB_0031dc1b;
    osErrorNumber = _::Debug::getOsErrorNumber(false);
  } while (osErrorNumber == -1);
  if (osErrorNumber != 0) {
    _::Debug::Fault::Fault
              (&local_20,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
               ,0x675,osErrorNumber,
               "newFd = open(dir, O_RDONLY | MAYBE_O_CLOEXEC | MAYBE_O_DIRECTORY)","");
    _::Debug::Fault::fatal(&local_20);
  }
LAB_0031dc1b:
  *(int *)&(this->super_Filesystem)._vptr_Filesystem = iVar1;
  UnwindDetector::UnwindDetector
            ((UnwindDetector *)((long)&(this->super_Filesystem)._vptr_Filesystem + 4));
  return (AutoCloseFd)this;
}

Assistant:

static AutoCloseFd openDir(const char* dir) {
    int newFd;
    KJ_SYSCALL(newFd = open(dir, O_RDONLY | MAYBE_O_CLOEXEC | MAYBE_O_DIRECTORY));
    AutoCloseFd result(newFd);
#ifndef O_CLOEXEC
    setCloexec(result);
#endif
    return result;
  }